

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_C_Test::TestBody(PhPacker_Arg_C_Test *this)

{
  uchar uVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  string local_a0;
  uint local_7c;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  uchar expected;
  any local_48;
  uchar local_31;
  undefined1 local_30 [7];
  uchar result;
  string str;
  PhPacker_Arg_C_Test *this_local;
  
  str.field_2._8_8_ = this;
  PhPacker::pack<unsigned_char,_0>((string *)local_30,'C','{');
  PhPacker::unpack((PhPacker *)&local_48,'C',(string *)local_30);
  uVar1 = std::any_cast<unsigned_char>(&local_48);
  std::any::~any(&local_48);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_1_ = 0x7b;
  local_31 = uVar1;
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
            ((EqHelper *)local_68,"result","expected",&local_31,
             (uchar *)((long)&gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 3));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x1a4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  local_7c = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if (local_7c == 0) {
    PhPacker::pack<unsigned_char,_0>(&local_a0,'C',200);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    PhPacker::unpack((PhPacker *)&gtest_ar_1.message_,'C',(string *)local_30);
    local_31 = std::any_cast<unsigned_char>((any *)&gtest_ar_1.message_);
    std::any::~any((any *)&gtest_ar_1.message_);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._3_1_ = 200;
    testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
              ((EqHelper *)local_c0,"result","expected",&local_31,
               (uchar *)((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 3));
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x1a9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    local_7c = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    if (local_7c == 0) {
      local_7c = 0;
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(PhPacker, Arg_C)
{
   std::string str = PhPacker::pack<unsigned char>('C', 123);
   unsigned char result = std::any_cast<unsigned char>(PhPacker::unpack('C', str));
   unsigned char expected = 123;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<unsigned char>('C', 200);
   result = std::any_cast<unsigned char>(PhPacker::unpack('C', str));
   expected = 200;
   GTEST_ASSERT_EQ(result, expected);
}